

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O1

bool __thiscall
HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::findPosition
          (HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *this,KeyType *key,u8 *meta,
          u64 *startPos,u64 *maxPos,u64 *pos)

{
  HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void> *pHVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  _Head_base<0UL,_HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>_*,_false> _Var5;
  uchar *puVar6;
  u64 uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar8 = ((ulong)(uint)(key->super__Tuple_impl<0UL,_int,_int,_unsigned_int>).
                        super__Head_base<0UL,_int,_false>._M_head_impl * -0x75e7c76a1153eaca +
           0x1da24fc66dd63e32 >> 0x20 ^
          ((ulong)(uint)(key->super__Tuple_impl<0UL,_int,_int,_unsigned_int>).
                        super__Tuple_impl<1UL,_int,_unsigned_int>.super__Head_base<1UL,_int,_false>.
                        _M_head_impl + 0x80c8963be3e4c2f3) *
          ((ulong)(key->super__Tuple_impl<0UL,_int,_int,_unsigned_int>).
                  super__Tuple_impl<1UL,_int,_unsigned_int>.super__Tuple_impl<2UL,_unsigned_int>.
                  super__Head_base<2UL,_unsigned_int,_false>._M_head_impl + 0xc8497d2a400d9551)) *
          -0x61c8864680b583eb;
  uVar9 = uVar8 >> ((byte)this->numHashShift & 0x3f);
  *startPos = uVar9;
  *maxPos = uVar9 + 0x7f & this->tableSizeMask;
  *meta = (byte)(uVar8 >> ((byte)this->numHashShift & 0x3f)) | 0x80;
  _Var5._M_head_impl =
       (this->entries)._M_t.
       super___uniq_ptr_impl<HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>,_HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::OpNewDeleter>
       ._M_t.
       super__Tuple_impl<0UL,_HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>_*,_HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::OpNewDeleter>
       .
       super__Head_base<0UL,_HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>_*,_false>
       ._M_head_impl;
  *pos = *startPos;
  puVar6 = (this->metadata)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  uVar3 = (key->super__Tuple_impl<0UL,_int,_int,_unsigned_int>).
          super__Tuple_impl<1UL,_int,_unsigned_int>.super__Head_base<1UL,_int,_false>._M_head_impl;
  iVar4 = (key->super__Tuple_impl<0UL,_int,_int,_unsigned_int>).super__Head_base<0UL,_int,_false>.
          _M_head_impl;
  do {
    uVar7 = *pos;
    bVar2 = puVar6[uVar7];
    if (-1 < (char)bVar2) {
      return false;
    }
    if ((((bVar2 == *meta) && (iVar4 == *(int *)((long)(_Var5._M_head_impl + uVar7) + 8))) &&
        (pHVar1 = _Var5._M_head_impl + uVar7,
        uVar3 == ((_Head_base<1UL,_int,_false> *)((long)&pHVar1->value_ + 4))->_M_head_impl)) &&
       ((key->super__Tuple_impl<0UL,_int,_int,_unsigned_int>).
        super__Tuple_impl<1UL,_int,_unsigned_int>.super__Tuple_impl<2UL,_unsigned_int>.
        super__Head_base<2UL,_unsigned_int,_false>._M_head_impl == *(uint *)&pHVar1->value_)) {
      return true;
    }
    if ((ulong)((int)uVar7 - (uint)bVar2 & 0x7f) < (uVar7 - *startPos & this->tableSizeMask)) {
      return false;
    }
    uVar8 = this->tableSizeMask & uVar7 + 1;
    *pos = uVar8;
  } while (uVar8 != *maxPos);
  return false;
}

Assistant:

bool findPosition(const KeyType& key, u8& meta, u64& startPos, u64& maxPos,
                    u64& pos) const {
    u64 hash = HighsHashHelpers::hash(key);
    startPos = hash >> numHashShift;
    maxPos = (startPos + maxDistance()) & tableSizeMask;
    meta = toMetadata(hash);

    const Entry* entryArray = entries.get();
    pos = startPos;
    do {
      if (!occupied(metadata[pos])) return false;
      if (metadata[pos] == meta &&
          HighsHashHelpers::equal(key, entryArray[pos].key()))
        return true;

      u64 currentDistance = (pos - startPos) & tableSizeMask;
      if (currentDistance > distanceFromIdealSlot(pos)) return false;

      pos = (pos + 1) & tableSizeMask;
    } while (pos != maxPos);

    return false;
  }